

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

bool __thiscall presolve::HPresolve::isImpliedInteger(HPresolve *this,HighsInt col)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  HighsLp *pHVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  vector<double,_std::allocator<double>_> *pvVar9;
  double *pdVar10;
  vector<double,_std::allocator<double>_> *pvVar11;
  double *pdVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  piVar4 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[col];
  pdVar10 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar13;
  pdVar12 = (double *)
            ((this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + lVar13);
  if (lVar13 == -1) {
    pdVar10 = (double *)0x0;
    pdVar12 = (double *)0x0;
  }
  bVar6 = true;
  do {
    if ((int)lVar13 == -1) {
      if (bVar6) {
        pHVar5 = this->model;
        dVar14 = (pHVar5->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[col];
        if (((dVar14 <= -INFINITY) ||
            (dVar15 = round(dVar14),
            pdVar12 = &(this->options->super_HighsOptionsStruct).small_matrix_value,
            ABS(dVar14 - dVar15) < *pdVar12 || ABS(dVar14 - dVar15) == *pdVar12)) &&
           ((dVar14 = (pHVar5->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[col], INFINITY <= dVar14 ||
            (dVar15 = round(dVar14),
            pdVar12 = &(this->options->super_HighsOptionsStruct).small_matrix_value,
            ABS(dVar14 - dVar15) < *pdVar12 || ABS(dVar14 - dVar15) == *pdVar12)))) {
          lVar13 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[col];
          pdVar12 = (double *)
                    ((this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar13);
          if (lVar13 == -1) {
            pdVar12 = (double *)0x0;
          }
          piVar4 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar10 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar13;
          if (lVar13 == -1) {
            pdVar10 = (double *)0x0;
          }
          while( true ) {
            bVar6 = (int)lVar13 == -1;
            if (bVar6) {
              return bVar6;
            }
            dVar15 = 1.0 / *pdVar10;
            pHVar5 = this->model;
            iVar2 = *(int *)pdVar12;
            dVar14 = (pHVar5->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar2];
            if ((dVar14 < INFINITY) &&
               (dVar14 = dVar14 * dVar15, dVar16 = round(dVar14), dVar14 = ABS(dVar14 - dVar16),
               this->primal_feastol <= dVar14 && dVar14 != this->primal_feastol)) break;
            dVar14 = (pHVar5->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar2];
            if ((-INFINITY < dVar14) &&
               (dVar14 = dVar14 * dVar15, dVar16 = round(dVar14), dVar14 = ABS(dVar14 - dVar16),
               this->primal_feastol <= dVar14 && dVar14 != this->primal_feastol)) {
              return bVar6;
            }
            bVar7 = rowCoefficientsIntegral(this,iVar2,dVar15);
            if (!bVar7) {
              return bVar6;
            }
            lVar8 = (long)(int)lVar13;
            lVar13 = (long)piVar4[lVar8];
            pdVar12 = (double *)((long)pdVar12 + lVar13 * 4 + lVar8 * -4);
            pdVar10 = pdVar10 + (lVar13 - lVar8);
          }
          return bVar6;
        }
      }
      return false;
    }
    iVar2 = *(int *)pdVar12;
    iVar3 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2];
    if ((iVar3 < 2) ||
       ((this->rowsizeImplInt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar2] +
        (this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar2] < iVar3 + -1)) {
LAB_002fffc4:
      bVar6 = false;
    }
    else {
      pHVar5 = this->model;
      dVar14 = (this->options->super_HighsOptionsStruct).dual_feasibility_tolerance;
      dVar15 = -dVar14;
      pdVar1 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + iVar2;
      pvVar9 = &pHVar5->row_lower_;
      if (*pdVar1 <= dVar15 && dVar15 != *pdVar1) {
        pvVar9 = &pHVar5->row_upper_;
      }
      pvVar11 = &pHVar5->row_upper_;
      if (dVar14 < (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar2]) {
        pvVar11 = &pHVar5->row_lower_;
      }
      dVar14 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[iVar2];
      pdVar1 = (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start + iVar2;
      if ((dVar14 == *pdVar1) && (!NAN(dVar14) && !NAN(*pdVar1))) {
        dVar14 = *pdVar10;
        dVar16 = (pHVar5->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar2] * (1.0 / dVar14);
        dVar15 = round(dVar16);
        dVar15 = ABS(dVar16 - dVar15);
        if ((dVar15 < this->primal_feastol || dVar15 == this->primal_feastol) &&
           (bVar6 = rowCoefficientsIntegral(this,iVar2,1.0 / dVar14), bVar6)) {
          return true;
        }
        goto LAB_002fffc4;
      }
    }
    lVar8 = (long)(int)lVar13;
    lVar13 = (long)piVar4[lVar8];
    pdVar12 = (double *)((long)pdVar12 + lVar13 * 4 + lVar8 * -4);
    pdVar10 = pdVar10 + (lVar13 - lVar8);
  } while( true );
}

Assistant:

bool HPresolve::isImpliedInteger(HighsInt col) {
  // check if a continuous variable is implied integer
  assert(model->integrality_[col] == HighsVarType::kContinuous);

  bool runDualDetection = true;

  for (const HighsSliceNonzero& nz : getColumnVector(col)) {
    // if not all other columns are integer, skip row and also do not try the
    // dual detection in the second loop as it must hold for all rows
    if (rowsize[nz.index()] < 2 ||
        rowsizeInteger[nz.index()] + rowsizeImplInt[nz.index()] <
            rowsize[nz.index()] - 1) {
      runDualDetection = false;
      continue;
    }

    double rowLower = isImpliedEquationAtUpper(nz.index())
                          ? model->row_upper_[nz.index()]
                          : model->row_lower_[nz.index()];

    double rowUpper = isImpliedEquationAtLower(nz.index())
                          ? model->row_lower_[nz.index()]
                          : model->row_upper_[nz.index()];

    if (rowUpper == rowLower) {
      // if there is an equation the dual detection does not need to be tried
      runDualDetection = false;
      double scale = 1.0 / nz.value();

      if (fractionality(model->row_lower_[nz.index()] * scale) >
          primal_feastol) {
        continue;
      }

      if (!rowCoefficientsIntegral(nz.index(), scale)) continue;

      return true;
    }
  }

  if (!runDualDetection) return false;

  if ((model->col_lower_[col] != -kHighsInf &&
       fractionality(model->col_lower_[col]) > options->small_matrix_value) ||
      (model->col_upper_[col] != kHighsInf &&
       fractionality(model->col_upper_[col]) > options->small_matrix_value))
    return false;

  for (const HighsSliceNonzero& nz : getColumnVector(col)) {
    double scale = 1.0 / nz.value();
    if (model->row_upper_[nz.index()] != kHighsInf &&
        fractionality(model->row_upper_[nz.index()] * scale) > primal_feastol)
      return false;

    if (model->row_lower_[nz.index()] != -kHighsInf &&
        fractionality(model->row_lower_[nz.index()] * scale) > primal_feastol)
      return false;

    if (!rowCoefficientsIntegral(nz.index(), scale)) return false;
  }

  return true;
}